

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map-util.h
# Opt level: O0

bool google::protobuf::
     InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>,std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>>
               (map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
                *collection,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *key,pair<const_void_*,_int> *value)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>,_bool>
  pVar1;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>
  local_68;
  _Base_ptr local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>,_bool>
  ret;
  pair<const_void_*,_int> *value_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *key_local;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
  *collection_local;
  
  ret._8_8_ = value;
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>
  ::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_true>
            (&local_68,key,value);
  pVar1 = std::
          map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
          ::insert(collection,&local_68);
  local_30 = (_Base_ptr)pVar1.first._M_node;
  ret.first._M_node._0_1_ = pVar1.second;
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>
  ::~pair(&local_68);
  return (bool)((byte)ret.first._M_node & 1);
}

Assistant:

bool InsertIfNotPresent(Collection * const collection,
                        const Key& key, const Value& value) {
  pair<typename Collection::iterator, bool> ret =
    collection->insert(typename Collection::value_type(key, value));
  return ret.second;
}